

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# D3MFExporter.cpp
# Opt level: O0

void __thiscall
Assimp::D3MF::D3MFExporter::D3MFExporter(D3MFExporter *this,char *pFile,aiScene *pScene)

{
  allocator<char> local_21;
  aiScene *local_20;
  aiScene *pScene_local;
  char *pFile_local;
  D3MFExporter *this_local;
  
  local_20 = pScene;
  pScene_local = (aiScene *)pFile;
  pFile_local = (char *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)this,pFile,&local_21);
  std::allocator<char>::~allocator(&local_21);
  this->m_zipArchive = (zip_t *)0x0;
  this->mScene = local_20;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&this->mModelOutput);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&this->mRelOutput);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&this->mContentOutput);
  memset(&this->mBuildItems,0,0x18);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&this->mBuildItems);
  memset(&this->mRelations,0,0x18);
  std::
  vector<Assimp::D3MF::OpcPackageRelationship_*,_std::allocator<Assimp::D3MF::OpcPackageRelationship_*>_>
  ::vector(&this->mRelations);
  return;
}

Assistant:

D3MFExporter::D3MFExporter( const char* pFile, const aiScene* pScene )
: mArchiveName( pFile )
, m_zipArchive( nullptr )
, mScene( pScene )
, mModelOutput()
, mRelOutput()
, mContentOutput()
, mBuildItems()
, mRelations() {
    // empty
}